

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushFont(ImFont *font)

{
  int *piVar1;
  ImFont **ppIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImFont **__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  if ((font == (ImFont *)0x0) && (font = (GImGui->IO).FontDefault, font == (ImFont *)0x0)) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  iVar4 = (pIVar3->FontStack).Size;
  if (iVar4 == (pIVar3->FontStack).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImFont **)(*GImAllocatorAllocFunc)((long)iVar6 << 3,GImAllocatorUserData);
    ppIVar2 = (pIVar3->FontStack).Data;
    if (ppIVar2 != (ImFont **)0x0) {
      memcpy(__dest,ppIVar2,(long)(pIVar3->FontStack).Size << 3);
      ppIVar2 = (pIVar3->FontStack).Data;
      if ((ppIVar2 != (ImFont **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
    }
    (pIVar3->FontStack).Data = __dest;
    (pIVar3->FontStack).Capacity = iVar6;
    iVar4 = (pIVar3->FontStack).Size;
  }
  else {
    __dest = (pIVar3->FontStack).Data;
  }
  __dest[iVar4] = font;
  (pIVar3->FontStack).Size = (pIVar3->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar3->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}